

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_benchmark.c
# Opt level: O1

int main(void)

{
  rle16_t *prVar1;
  ushort uVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  run_container_t *prVar6;
  ulong uVar7;
  rle16_t *prVar8;
  void *pvVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  run_container_t *prVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  byte bVar11;
  ulong uVar12;
  run_container_t *prVar13;
  int card_1;
  int iVar14;
  ulong extraout_RDX;
  long lVar15;
  int j_2;
  int card;
  int x_1;
  int iVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int i_1;
  ushort uVar24;
  int x;
  int iVar25;
  int i;
  int iVar26;
  long lVar27;
  bool bVar28;
  rle16_t rVar29;
  float fVar30;
  timespec ts;
  timespec local_78;
  run_container_t *local_68;
  run_container_t *local_60;
  run_container_t *local_58;
  run_container_t *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  puVar3 = (uint *)cpuid_Version_info(1);
  uVar12 = (ulong)puVar3[3];
  uVar5 = *puVar3 >> 4;
  if (uVar5 < 0x406c) {
    if (uVar5 < 0x2065) {
      if (uVar5 < 0x266) {
        if (uVar5 < 0x6d) {
          uVar12 = (ulong)(uVar5 - 99);
          if (uVar5 - 99 < 2) {
            pcVar17 = "Prescott";
            goto LAB_00101557;
          }
          if (uVar5 == 0x66) {
            pcVar17 = "Presler";
            goto LAB_00101557;
          }
        }
        else {
          if (uVar5 == 0x6d) {
            pcVar17 = "Dothan";
            goto LAB_00101557;
          }
          if (uVar5 == 0x6f) goto switchD_00101304_caseD_0;
          if (uVar5 == 0x16c) {
            pcVar17 = "Pineview";
            goto LAB_00101557;
          }
        }
      }
      else {
        uVar7 = (ulong)(uVar5 - 0x1066);
        if (uVar5 - 0x1066 < 9) {
          uVar12 = (long)&switchD_00101304::switchdataD_00105030 +
                   (long)(int)(&switchD_00101304::switchdataD_00105030)[uVar7];
          switch(uVar7) {
          case 0:
switchD_00101304_caseD_0:
            pcVar17 = "Merom";
            goto LAB_00101557;
          case 1:
          case 7:
            pcVar17 = "Penryn";
            goto LAB_00101557;
          case 4:
          case 8:
switchD_00101304_caseD_4:
            pcVar17 = "Nehalem";
            goto LAB_00101557;
          }
        }
        else {
          uVar12 = uVar7;
          if (uVar5 == 0x266) {
            pcVar17 = "Lincroft";
            goto LAB_00101557;
          }
          if (uVar5 == 0x366) {
            pcVar17 = "Cedarview";
            goto LAB_00101557;
          }
        }
      }
    }
    else if (uVar5 < 0x306a) {
      uVar5 = uVar5 - 0x2065;
      if (uVar5 < 0xb) {
        uVar12 = 0x481;
        if ((0x481U >> (uVar5 & 0x1f) & 1) != 0) {
          pcVar17 = "Westmere";
          goto LAB_00101557;
        }
        uVar12 = 0x120;
        if ((0x120U >> (uVar5 & 0x1f) & 1) != 0) {
          pcVar17 = "SandyBridge";
          goto LAB_00101557;
        }
        if (uVar5 == 9) goto switchD_00101304_caseD_4;
      }
    }
    else if (uVar5 < 0x306d) {
      if (uVar5 == 0x306a) {
        pcVar17 = "IvyBridge";
        goto LAB_00101557;
      }
      if (uVar5 == 0x306c) {
        pcVar17 = "Haswell";
        goto LAB_00101557;
      }
    }
    else {
      if (uVar5 == 0x306d) {
        pcVar17 = "Broadwell";
        goto LAB_00101557;
      }
      if (uVar5 == 0x30f1) goto LAB_001014ea;
    }
  }
  else if (uVar5 < 0x9067) {
    if (uVar5 < 0x706a) {
      if (uVar5 < 0x606a) {
        if (uVar5 == 0x406c) {
          pcVar17 = "CherryTrail";
          goto LAB_00101557;
        }
        if (uVar5 == 0x506c) goto LAB_0010148a;
        if (uVar5 == 0x506e) {
          pcVar17 = "Skylake";
          goto LAB_00101557;
        }
      }
      else {
        if (uVar5 == 0x606a) {
LAB_00101496:
          pcVar17 = "Icelake";
          goto LAB_00101557;
        }
        if ((uVar5 == 0x60f0) || (uVar5 == 0x60f8)) {
LAB_001014ea:
          pcVar17 = "Zen2";
          goto LAB_00101557;
        }
      }
    }
    else if (uVar5 < 0x806c) {
      if (uVar5 == 0x706a) {
LAB_0010148a:
        pcVar17 = "Goldmont";
        goto LAB_00101557;
      }
      if (uVar5 == 0x706e) goto LAB_00101496;
      if (uVar5 == 0x70f1) goto LAB_001014ea;
    }
    else {
      uVar12 = (ulong)(uVar5 - 0x806c);
      if (uVar5 - 0x806c < 2) {
        pcVar17 = "TigerLake";
        goto LAB_00101557;
      }
      if (uVar5 == 0x806e) {
LAB_001014fa:
        pcVar17 = "Kabylake";
        goto LAB_00101557;
      }
    }
  }
  else if (uVar5 < 0xa067) {
    if (uVar5 < 0x90f0) {
      if ((uVar5 == 0x9067) || (uVar5 == 0x906a)) {
        pcVar17 = "Alderlake";
        goto LAB_00101557;
      }
      if (uVar5 == 0x906e) goto LAB_001014fa;
    }
    else {
      uVar12 = (ulong)(uVar5 - 0xa065);
      if (uVar5 - 0xa065 < 2) {
        pcVar17 = "Cometlake";
        goto LAB_00101557;
      }
      if (uVar5 == 0x90f0) goto LAB_001014ea;
    }
  }
  else if (uVar5 < 0x40f40) {
    if (uVar5 == 0xa067) {
      pcVar17 = "Rocketlake";
      goto LAB_00101557;
    }
    if (uVar5 == 0xb067) {
      pcVar17 = "Raptorlake";
      goto LAB_00101557;
    }
    if (uVar5 == 0x20f10) goto LAB_001014a2;
  }
  else {
    if (uVar5 == 0x40f40) {
      pcVar17 = "Zen3+";
      goto LAB_00101557;
    }
    if (uVar5 == 0x50f00) {
LAB_001014a2:
      pcVar17 = "Zen3";
      goto LAB_00101557;
    }
    if (uVar5 == 0x60f10) {
      pcVar17 = "Zen4";
      goto LAB_00101557;
    }
  }
  pcVar17 = "unknown";
LAB_00101557:
  iVar26 = 0;
  printf("x64 processor:  %s\t",pcVar17,(ulong)puVar3[2],uVar12);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar27 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar27 + 0xc) != '@') {
    lVar27 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar27 + 0xc),
           (ulong)*(uint *)(lVar27 + 8),(ulong)*(uint *)(lVar27 + 0xc));
  }
  puts("run container benchmarks");
  prVar6 = run_container_create();
  printf("%s: ","add_test(B)");
  fflush((FILE *)0x0);
  uVar12 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_78);
    lVar27 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
    local_68 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
    uVar5 = 0xfffffffd;
    do {
      uVar5 = uVar5 + 3;
      run_container_add(prVar6,(uint16_t)uVar5);
    } while (uVar5 < 0xfffd);
    clock_gettime(3,&local_78);
    uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar27) * 1000000000 +
            (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_68);
    if (uVar7 < uVar12) {
      uVar12 = uVar7;
    }
    iVar26 = iVar26 + 1;
  } while (iVar26 != 500);
  printf(" %.2f cycles per operation",(double)((float)uVar12 * 0.00048828125));
  putchar(10);
  iVar25 = 0;
  fflush((FILE *)0x0);
  prVar8 = prVar6->runs;
  iVar26 = 0;
  uVar12 = extraout_RDX;
  do {
    uVar5 = 0;
    iVar14 = prVar6->n_runs + -1;
    do {
      if (iVar14 < (int)uVar5) {
        uVar12 = (ulong)~uVar5;
        break;
      }
      uVar20 = uVar5 + iVar14 >> 1;
      if (prVar8[uVar20].value < (ushort)iVar25) {
        uVar5 = uVar20 + 1;
        bVar28 = true;
      }
      else if ((ushort)iVar25 < prVar8[uVar20].value) {
        iVar14 = uVar20 - 1;
        bVar28 = true;
      }
      else {
        bVar28 = false;
        uVar12 = (ulong)uVar20;
      }
    } while (bVar28);
    iVar16 = 1;
    iVar14 = (int)uVar12;
    if ((iVar14 < 0) &&
       ((iVar14 == -1 ||
        (uVar12 = (ulong)prVar8[-iVar14 - 2U].length,
        (int)(uint)prVar8[-iVar14 - 2U].length < (int)(iVar25 - (uint)prVar8[-iVar14 - 2U].value))))
       ) {
      iVar16 = 0;
    }
    iVar26 = iVar26 + iVar16;
    iVar25 = iVar25 + 1;
  } while (iVar25 != 0x10000);
  bVar28 = false;
  printf("%s: ","contains_test(B)");
  fflush((FILE *)0x0);
  uVar12 = 0xffffffffffffffff;
  iVar25 = 0;
  do {
    uVar7 = 3;
    clock_gettime(3,&local_78);
    local_60 = (run_container_t *)CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
    local_68 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
    prVar8 = prVar6->runs;
    iVar16 = 0;
    iVar14 = 0;
    do {
      uVar5 = 0;
      iVar22 = prVar6->n_runs + -1;
      do {
        if (iVar22 < (int)uVar5) {
          uVar7 = (ulong)~uVar5;
          break;
        }
        uVar20 = uVar5 + iVar22 >> 1;
        if (prVar8[uVar20].value < (ushort)iVar16) {
          uVar5 = uVar20 + 1;
          bVar4 = true;
        }
        else if ((ushort)iVar16 < prVar8[uVar20].value) {
          iVar22 = uVar20 - 1;
          bVar4 = true;
        }
        else {
          bVar4 = false;
          uVar7 = (ulong)uVar20;
        }
      } while (bVar4);
      iVar21 = 1;
      iVar22 = (int)uVar7;
      if ((iVar22 < 0) &&
         ((iVar22 == -1 ||
          (uVar7 = (ulong)prVar8[-iVar22 - 2U].length,
          (int)(uint)prVar8[-iVar22 - 2U].length < (int)(iVar16 - (uint)prVar8[-iVar22 - 2U].value))
          ))) {
        iVar21 = 0;
      }
      iVar14 = iVar14 + iVar21;
      iVar16 = iVar16 + 1;
    } while (iVar16 != 0x10000);
    if (iVar14 != iVar26) {
      bVar28 = true;
    }
    clock_gettime(3,&local_78);
    uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - (long)local_60) * 1000000000 +
            (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_68);
    if (uVar7 < uVar12) {
      uVar12 = uVar7;
    }
    iVar25 = iVar25 + 1;
  } while (iVar25 != 500);
  printf(" %.2f cycles per operation",(double)((float)uVar12 * 1.5258789e-05));
  if (bVar28) {
    printf(" [ERROR]");
  }
  putchar(10);
  uVar12 = 0;
  fflush((FILE *)0x0);
  printf("%s: ","remove_test(B)");
  fflush((FILE *)0x0);
  prVar13 = (run_container_t *)0xffffffffffffffff;
  uVar5 = 500;
  do {
    local_68 = (run_container_t *)uVar12;
    local_60 = prVar13;
    clock_gettime(3,&local_78);
    local_58 = (run_container_t *)CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
    local_50 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
    uVar20 = 0;
    do {
      prVar8 = prVar6->runs;
      iVar25 = prVar6->n_runs;
      iVar26 = iVar25 + -1;
      uVar19 = 0;
      do {
        uVar24 = (ushort)uVar20;
        if (iVar26 < (int)uVar19) {
          uVar5 = ~uVar19;
          break;
        }
        uVar18 = uVar19 + iVar26 >> 1;
        if (prVar8[uVar18].value < uVar24) {
          uVar19 = uVar18 + 1;
          bVar28 = true;
        }
        else if (uVar24 < prVar8[uVar18].value) {
          iVar26 = uVar18 - 1;
          bVar28 = true;
        }
        else {
          bVar28 = false;
          uVar5 = uVar18;
        }
      } while (bVar28);
      if ((int)uVar5 < 0) {
        if (uVar5 != 0xffffffff) {
          uVar12 = (ulong)(-uVar5 - 2);
          uVar19 = uVar20 - prVar8[uVar12].value;
          uVar2 = prVar8[uVar12].length;
          if ((int)uVar19 < (int)(uint)uVar2) {
            prVar8[uVar12].length = (ushort)uVar19 - 1;
            if (prVar6->capacity <= iVar25) {
              run_container_grow(prVar6,iVar25 + 1,true);
            }
            uVar5 = ~uVar5;
            uVar12 = (ulong)(uVar5 & 0xffff);
            memmove(prVar6->runs + uVar12 + 1,prVar6->runs + uVar12,
                    ((long)prVar6->n_runs - uVar12) * 4);
            prVar6->n_runs = prVar6->n_runs + 1;
            prVar8 = prVar6->runs;
            uVar12 = (ulong)uVar5;
            prVar8[uVar12].value = uVar24 + 1;
            uVar24 = ~(ushort)uVar19;
          }
          else {
            if (uVar19 != uVar2) goto LAB_00101a44;
            uVar24 = 0xffff;
          }
          prVar8[uVar12].length = uVar2 + uVar24;
        }
      }
      else if (prVar8[uVar5].length == 0) {
        uVar19 = uVar5 & 0xffff;
        memmove(prVar8 + uVar19,prVar8 + (ulong)uVar19 + 1,(long)(int)(iVar25 + ~uVar19) << 2);
        prVar6->n_runs = prVar6->n_runs + -1;
      }
      else {
        rVar29.value = prVar8[uVar5].value + 1;
        rVar29.length = prVar8[uVar5].length - 1;
        prVar8[uVar5] = rVar29;
      }
LAB_00101a44:
      bVar28 = uVar20 < 0xfffd;
      uVar20 = uVar20 + 3;
    } while (bVar28);
    clock_gettime(3,&local_78);
    pvVar9 = (void *)((CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - (long)local_58) *
                      1000000000 +
                     (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_50));
    prVar13 = local_60;
    if (pvVar9 < local_60) {
      prVar13 = (run_container_t *)pvVar9;
    }
    uVar20 = (int)local_68 + 1;
    uVar12 = (ulong)uVar20;
    if (uVar20 == 500) {
      printf(" %.2f cycles per operation",(double)((float)prVar13 / 21845.0));
      putchar(10);
      fflush((FILE *)0x0);
      run_container_free(prVar6);
      pvVar9 = (void *)0x20;
      do {
        prVar6 = run_container_create();
        local_50 = (run_container_t *)pvVar9;
        do {
          uVar5 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
          bVar11 = (byte)(pcg32_global_0 >> 0x3b);
          pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
          run_container_add(prVar6,(ushort)(uVar5 >> bVar11) | (ushort)(uVar5 << 0x20 - bVar11));
          uVar5 = (int)pvVar9 - 1;
          pvVar9 = (void *)(ulong)uVar5;
        } while (uVar5 != 0);
        uVar5 = run_container_cardinality(prVar6);
        bVar28 = false;
        printf("\n number of values in container = %d\n",(ulong)uVar5);
        iVar26 = run_container_cardinality(prVar6);
        local_68 = (run_container_t *)CONCAT44(extraout_var,iVar26);
        local_58 = (run_container_t *)(long)iVar26;
        local_60 = (run_container_t *)malloc((long)local_58 * 4);
        printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
        fflush((FILE *)0x0);
        iVar26 = 500;
        uVar12 = 0xffffffffffffffff;
        do {
          clock_gettime(3,&local_78);
          lVar27 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
          lVar15 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
          iVar25 = run_container_to_uint32_array(local_60,prVar6,0x4d2);
          if (iVar25 != (int)local_68) {
            bVar28 = true;
          }
          clock_gettime(3,&local_78);
          prVar13 = local_60;
          uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar27) * 1000000000 +
                  (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar15);
          if (uVar12 <= uVar7) {
            uVar7 = uVar12;
          }
          iVar26 = iVar26 + -1;
          uVar12 = uVar7;
        } while (iVar26 != 0);
        if ((long)local_58 < 0) {
          fVar30 = (float)((ulong)((uint)local_68 & 1) | (ulong)local_58 >> 1);
          fVar30 = fVar30 + fVar30;
        }
        else {
          fVar30 = (float)(int)(uint)local_68;
        }
        printf(" %.2f cycles per operation",(double)((float)uVar7 / fVar30));
        if (bVar28) {
          printf(" [ERROR]");
        }
        putchar(10);
        iVar26 = 0;
        fflush((FILE *)0x0);
        free(prVar13);
        printf("%s %s: ","run_container_contains","run_cache_prefetch");
        fflush((FILE *)0x0);
        lVar27 = 0;
        do {
          lVar15 = cpuid(0x80000006);
          if (0 < prVar6->n_runs) {
            uVar12 = 0;
            do {
              uVar12 = uVar12 + (*(uint *)(lVar15 + 0xc) >> 1 & 0x7f);
            } while (uVar12 < (ulong)(uint)prVar6->n_runs * 2);
          }
          clock_gettime(3,&local_78);
          iVar14 = (int)local_78.tv_nsec;
          iVar25 = (int)local_78.tv_sec;
          clock_gettime(3,&local_78);
          iVar26 = ((int)local_78.tv_sec - iVar25) * 1000000000 +
                   iVar26 + ((int)local_78.tv_nsec - iVar14);
          lVar27 = lVar27 + 1;
        } while (lVar27 != 0x400);
        printf(" %.2f cycles per operation",(double)((float)iVar26 * 0.0009765625));
        putchar(10);
        iVar26 = 0;
        fflush((FILE *)0x0);
        printf("%s %s: ","run_container_contains","run_cache_flush");
        fflush((FILE *)0x0);
        lVar27 = 0;
        do {
          lVar15 = cpuid(0x80000006);
          if (0 < prVar6->n_runs) {
            uVar5 = *(uint *)(lVar15 + 0xc) >> 1 & 0x7f;
            lVar15 = 0;
            iVar25 = 0;
            do {
              clflush(*(undefined1 *)((long)&prVar6->runs->value + lVar15));
              iVar25 = iVar25 + uVar5;
              lVar15 = lVar15 + (ulong)(uVar5 * 4);
            } while (iVar25 < prVar6->n_runs * 2);
          }
          clock_gettime(3,&local_78);
          iVar14 = (int)local_78.tv_nsec;
          iVar25 = (int)local_78.tv_sec;
          clock_gettime(3,&local_78);
          iVar26 = ((int)local_78.tv_sec - iVar25) * 1000000000 +
                   iVar26 + ((int)local_78.tv_nsec - iVar14);
          lVar27 = lVar27 + 1;
        } while (lVar27 != 0x400);
        printf(" %.2f cycles per operation",(double)((float)iVar26 * 0.0009765625));
        putchar(10);
        fflush((FILE *)0x0);
        run_container_free(prVar6);
        pvVar9 = (void *)(ulong)((uint)local_50 * 8);
      } while ((uint)local_50 < 0x2001);
      puts("==dense range test ");
      local_68 = (run_container_t *)0x20;
      do {
        prVar6 = run_container_create();
        iVar26 = 0;
        do {
          uVar12 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
          uVar5 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
          bVar11 = (byte)(pcg32_global_0 >> 0x3b);
          uVar20 = (uVar5 >> bVar11 | uVar5 << 0x20 - bVar11) & 0xfff;
          uVar5 = uVar20 + 0x1000;
          prVar8 = prVar6->runs;
          iVar25 = prVar6->n_runs;
          iVar14 = 0;
          if (iVar25 != 0) {
            iVar16 = iVar25 + -1;
            iVar22 = 0;
            do {
              if (iVar16 < iVar22) {
                iVar14 = iVar25 - iVar22;
                break;
              }
              uVar19 = (uint)(iVar22 + iVar16) >> 1;
              if ((ushort)(prVar8[uVar19].length + prVar8[uVar19].value) < (ushort)uVar5) {
                iVar22 = uVar19 + 1;
                bVar28 = true;
              }
              else if (uVar20 + 0x1001 < (uint)prVar8[uVar19].value) {
                iVar16 = uVar19 - 1;
                bVar28 = true;
              }
              else {
                iVar14 = ~uVar19 + iVar25;
                bVar28 = false;
              }
            } while (bVar28);
          }
          iVar16 = iVar25 - iVar14;
          uVar24 = (ushort)uVar20;
          uVar19 = 0;
          if (iVar16 != 0) {
            iVar22 = iVar16 + -1;
            uVar23 = 0;
            uVar18 = 0;
            do {
              uVar19 = uVar23;
              if (iVar22 < (int)uVar23) break;
              uVar19 = uVar23 + iVar22 >> 1;
              if ((ushort)(prVar8[uVar19].length + prVar8[uVar19].value) + 1 < uVar20) {
                uVar23 = uVar19 + 1;
                bVar28 = true;
                uVar19 = uVar18;
              }
              else if (uVar24 < prVar8[uVar19].value) {
                iVar22 = uVar19 - 1;
                bVar28 = true;
                uVar19 = uVar18;
              }
              else {
                bVar28 = false;
              }
              uVar18 = uVar19;
            } while (bVar28);
          }
          pcg32_global_0 = uVar12;
          if (iVar25 == iVar14 + uVar19) {
            if (prVar6->capacity <= iVar25) {
              run_container_grow(prVar6,iVar25 + 1,true);
            }
            uVar7 = (ulong)(int)uVar19;
            uVar12 = uVar7 & 0xffff;
            memmove(prVar6->runs + uVar12 + 1,prVar6->runs + uVar12,
                    ((long)prVar6->n_runs - uVar12) * 4);
            prVar6->n_runs = prVar6->n_runs + 1;
            prVar8 = prVar6->runs;
            prVar8[uVar7].value = uVar24;
            prVar8[uVar7].length = (ushort)uVar5 - uVar24;
          }
          else {
            prVar1 = prVar8 + (int)uVar19;
            prVar8 = prVar8 + iVar16;
            uVar18 = (uint)prVar8[-1].length + (uint)prVar8[-1].value;
            if (prVar1->value < uVar20) {
              uVar20 = (uint)prVar1->value;
            }
            if (uVar18 <= uVar5) {
              uVar18 = uVar5;
            }
            prVar1->value = (uint16_t)uVar20;
            prVar1->length = (short)uVar18 - (uint16_t)uVar20;
            memmove(prVar1 + 1,prVar8,(long)iVar14 << 2);
            prVar6->n_runs = uVar19 + iVar14 + 1;
          }
          iVar26 = iVar26 + 1;
        } while (iVar26 != (int)local_68);
        uVar5 = run_container_cardinality(prVar6);
        bVar28 = false;
        printf("\n number of values in container = %d\n",(ulong)uVar5);
        iVar26 = run_container_cardinality(prVar6);
        local_60 = (run_container_t *)CONCAT44(extraout_var_00,iVar26);
        local_48 = (ulong)iVar26;
        local_50 = (run_container_t *)malloc(local_48 * 4);
        printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
        fflush((FILE *)0x0);
        iVar26 = 500;
        uVar12 = 0xffffffffffffffff;
        local_58 = prVar6;
        do {
          clock_gettime(3,&local_78);
          lVar27 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
          lVar15 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
          iVar25 = run_container_to_uint32_array(local_50,local_58,0x4d2);
          if (iVar25 != (int)local_60) {
            bVar28 = true;
          }
          clock_gettime(3,&local_78);
          prVar13 = local_50;
          prVar6 = local_58;
          uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar27) * 1000000000 +
                  (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar15);
          if (uVar12 <= uVar7) {
            uVar7 = uVar12;
          }
          iVar26 = iVar26 + -1;
          uVar12 = uVar7;
        } while (iVar26 != 0);
        if ((long)local_48 < 0) {
          fVar30 = (float)((ulong)((uint)local_60 & 1) | local_48 >> 1);
          fVar30 = fVar30 + fVar30;
        }
        else {
          fVar30 = (float)(int)(uint)local_60;
        }
        printf(" %.2f cycles per operation",(double)((float)uVar7 / fVar30));
        if (bVar28) {
          printf(" [ERROR]");
        }
        putchar(10);
        fflush((FILE *)0x0);
        free(prVar13);
        run_container_free(prVar6);
        uVar5 = (uint)local_68;
        local_68 = (run_container_t *)(ulong)(uVar5 * 8);
        if (0x2000 < uVar5) {
          putchar(10);
          uVar5 = 0xfffffffd;
          local_68 = run_container_create();
          do {
            uVar5 = uVar5 + 3;
            run_container_add(local_68,(uint16_t)uVar5);
          } while (uVar5 < 0xfffd);
          uVar5 = 0xfffffffb;
          prVar6 = run_container_create();
          do {
            uVar5 = uVar5 + 5;
            run_container_add(prVar6,(uint16_t)uVar5);
          } while (uVar5 < 0xfffb);
          prVar10 = run_container_create();
          puts("\nUnion and intersections...");
          puts("\nNote:");
          puts("union times are expressed in cycles per number of input elements (both runs)");
          puts("intersection times are expressed in cycles per number of output elements\n");
          puts("==intersection and union test 1 ");
          prVar13 = local_68;
          uVar5 = run_container_cardinality(local_68);
          uVar20 = run_container_cardinality(prVar6);
          bVar28 = false;
          printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar5,(ulong)uVar20)
          ;
          run_container_union(prVar13,prVar6,prVar10);
          local_50 = prVar10;
          uVar5 = run_container_cardinality(prVar10);
          local_48 = CONCAT44(local_48._4_4_,uVar5);
          printf("union cardinality = %d \n",(ulong)uVar5);
          uVar5 = run_container_cardinality(prVar13);
          uVar20 = run_container_cardinality(prVar6);
          printf("B1 card = %d B2 card = %d \n",(ulong)uVar5,(ulong)uVar20);
          local_38 = (long)prVar13->n_runs;
          local_40 = (long)prVar6->n_runs;
          printf("%s: ","union_test(B1, B2, BO)");
          fflush((FILE *)0x0);
          prVar13 = local_50;
          iVar26 = 500;
          uVar12 = 0xffffffffffffffff;
          local_60 = prVar6;
          do {
            clock_gettime(3,&local_78);
            lVar27 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
            local_58 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
            run_container_union(local_68,local_60,prVar13);
            iVar25 = run_container_cardinality(prVar13);
            if (iVar25 != (int)local_48) {
              bVar28 = true;
            }
            clock_gettime(3,&local_78);
            prVar10 = local_50;
            prVar6 = local_60;
            uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar27) * 1000000000 +
                    (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_58);
            if (uVar12 <= uVar7) {
              uVar7 = uVar12;
            }
            iVar26 = iVar26 + -1;
            uVar12 = uVar7;
          } while (iVar26 != 0);
          printf(" %.2f cycles per operation",
                 (double)((float)uVar7 / (float)(ulong)(local_40 + local_38)));
          if (bVar28) {
            printf(" [ERROR]");
          }
          putchar(10);
          bVar28 = false;
          fflush((FILE *)0x0);
          run_container_intersection(local_68,prVar6,prVar10);
          uVar5 = run_container_cardinality(prVar10);
          local_58 = (run_container_t *)CONCAT44(extraout_var_01,uVar5);
          printf("intersection cardinality = %d \n",(ulong)uVar5);
          printf("%s: ","intersection_test(B1, B2, BO)");
          fflush((FILE *)0x0);
          prVar6 = local_50;
          iVar26 = 500;
          uVar12 = 0xffffffffffffffff;
          do {
            clock_gettime(3,&local_78);
            lVar27 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
            lVar15 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
            run_container_intersection(local_68,local_60,prVar6);
            iVar25 = run_container_cardinality(prVar6);
            if (iVar25 != (int)local_58) {
              bVar28 = true;
            }
            clock_gettime(3,&local_78);
            prVar13 = local_60;
            uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar27) * 1000000000 +
                    (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar15);
            if (uVar12 <= uVar7) {
              uVar7 = uVar12;
            }
            iVar26 = iVar26 + -1;
            uVar12 = uVar7;
          } while (iVar26 != 0);
          uVar5 = (uint)local_58;
          if ((long)(int)uVar5 < 0) {
            fVar30 = (float)((ulong)(uVar5 & 1) | (ulong)(long)(int)uVar5 >> 1);
            fVar30 = fVar30 + fVar30;
          }
          else {
            fVar30 = (float)(int)uVar5;
          }
          printf(" %.2f cycles per operation",(double)((float)uVar7 / fVar30));
          if (bVar28) {
            printf(" [ERROR]");
          }
          putchar(10);
          uVar12 = 0;
          fflush((FILE *)0x0);
          puts("==intersection and union test 2 ");
          local_68->n_runs = 0;
          prVar13->n_runs = 0;
          do {
            uVar20 = (uint)uVar12;
            uVar5 = (int)(uVar12 / 0xb) + (int)(uVar12 / 0xb) * 10;
            if (uVar20 != uVar5) {
              uVar19 = 0;
              do {
                run_container_add(local_68,(short)uVar12 + (short)uVar19);
                uVar19 = uVar19 + 1;
              } while (uVar19 < uVar20 - uVar5);
            }
            uVar12 = (ulong)(uVar20 + 0x40);
          } while (uVar20 < 0xffc0);
          iVar26 = 1;
          do {
            run_container_add(prVar13,(uint16_t)iVar26);
            prVar6 = local_68;
            bVar28 = iVar26 < 0x8000;
            iVar26 = iVar26 * 2;
          } while (bVar28);
          uVar5 = run_container_cardinality(local_68);
          uVar20 = run_container_cardinality(prVar13);
          bVar28 = false;
          printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar5,(ulong)uVar20)
          ;
          prVar10 = local_50;
          run_container_union(prVar6,prVar13,local_50);
          uVar5 = run_container_cardinality(prVar10);
          local_58 = (run_container_t *)CONCAT44(local_58._4_4_,uVar5);
          printf("union cardinality = %d \n",(ulong)uVar5);
          uVar5 = run_container_cardinality(prVar6);
          uVar20 = run_container_cardinality(prVar13);
          printf("B1 card = %d B2 card = %d \n",(ulong)uVar5,(ulong)uVar20);
          local_40 = (long)prVar6->n_runs;
          local_48 = (ulong)prVar13->n_runs;
          printf("%s: ","union_test(B1, B2, BO)");
          fflush((FILE *)0x0);
          iVar26 = 500;
          uVar12 = 0xffffffffffffffff;
          do {
            clock_gettime(3,&local_78);
            prVar6 = local_50;
            lVar27 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
            lVar15 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
            run_container_union(local_68,local_60,local_50);
            iVar25 = run_container_cardinality(prVar6);
            if (iVar25 != (int)local_58) {
              bVar28 = true;
            }
            clock_gettime(3,&local_78);
            prVar13 = local_50;
            prVar6 = local_60;
            uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar27) * 1000000000 +
                    (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar15);
            if (uVar12 <= uVar7) {
              uVar7 = uVar12;
            }
            iVar26 = iVar26 + -1;
            uVar12 = uVar7;
          } while (iVar26 != 0);
          printf(" %.2f cycles per operation",(double)((float)uVar7 / (float)(local_48 + local_40)))
          ;
          if (bVar28) {
            printf(" [ERROR]");
          }
          putchar(10);
          bVar28 = false;
          fflush((FILE *)0x0);
          run_container_intersection(local_68,prVar6,prVar13);
          uVar5 = run_container_cardinality(prVar13);
          local_58 = (run_container_t *)CONCAT44(extraout_var_02,uVar5);
          printf("intersection cardinality = %d \n",(ulong)uVar5);
          printf("%s: ","intersection_test(B1, B2, BO)");
          fflush((FILE *)0x0);
          prVar6 = local_50;
          iVar26 = 500;
          uVar12 = 0xffffffffffffffff;
          do {
            clock_gettime(3,&local_78);
            lVar27 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
            lVar15 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
            run_container_intersection(local_68,local_60,prVar6);
            iVar25 = run_container_cardinality(prVar6);
            if (iVar25 != (int)local_58) {
              bVar28 = true;
            }
            clock_gettime(3,&local_78);
            prVar13 = local_60;
            uVar7 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar27) * 1000000000 +
                    (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar15);
            if (uVar12 <= uVar7) {
              uVar7 = uVar12;
            }
            iVar26 = iVar26 + -1;
            uVar12 = uVar7;
          } while (iVar26 != 0);
          uVar5 = (uint)local_58;
          if ((long)(int)uVar5 < 0) {
            fVar30 = (float)((ulong)(uVar5 & 1) | (ulong)(long)(int)uVar5 >> 1);
            fVar30 = fVar30 + fVar30;
          }
          else {
            fVar30 = (float)(int)uVar5;
          }
          printf(" %.2f cycles per operation",(double)((float)uVar7 / fVar30));
          if (bVar28) {
            printf(" [ERROR]");
          }
          putchar(10);
          fflush((FILE *)0x0);
          run_container_free(local_68);
          run_container_free(prVar13);
          run_container_free(local_50);
          return 0;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

int main() {
    int repeat = 500;
    int size = TESTSIZE;
    tellmeall();
    printf("run container benchmarks\n");
    run_container_t* B = run_container_create();
    BEST_TIME(add_test(B), 0, repeat, size);
    int answer = contains_test(B);
    size = 1 << 16;
    BEST_TIME(contains_test(B), answer, repeat, size);
    size = (1 << 16) / 3;
    BEST_TIME(remove_test(B), 0, repeat, size);
    run_container_free(B);

    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            run_container_add(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        run_container_free(Bt);
    }

    printf("==dense range test \n");
    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            uint16_t min = (uint16_t)pcg32_random() % 4096;
            uint16_t max = min + 4096;
            int32_t nruns_greater =
                rle16_count_greater(Bt->runs, Bt->n_runs, max);
            int32_t nruns_less =
                rle16_count_less(Bt->runs, Bt->n_runs - nruns_greater, min);
            run_container_add_range_nruns(Bt, min, max, nruns_less,
                                          nruns_greater);
        }
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);

        run_container_free(Bt);
    }

    printf("\n");

    run_container_t* B1 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        run_container_add(B1, (uint16_t)x);
    }
    run_container_t* B2 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        run_container_add(B2, (uint16_t)x);
    }
    int32_t inputsize;
    inputsize = B1->n_runs + B2->n_runs;
    run_container_t* BO = run_container_create();
    printf("\nUnion and intersections...\n");
    printf("\nNote:\n");
    printf(
        "union times are expressed in cycles per number of input elements "
        "(both runs)\n");
    printf(
        "intersection times are expressed in cycles per number of output "
        "elements\n\n");
    printf("==intersection and union test 1 \n");
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;
    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);
    printf("==intersection and union test 2 \n");
    B1->n_runs = 0;
    B2->n_runs = 0;
    for (int x = 0; x < (1 << 16); x += 64) {
        int length = x % 11;
        for (int y = 0; y < length; ++y)
            run_container_add(B1, (uint16_t)(x + y));
    }
    for (int x = 1; x < 1 << 16; x += x) {
        run_container_add(B2, (uint16_t)x);
    }
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;

    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);

    run_container_free(B1);
    run_container_free(B2);
    run_container_free(BO);
    return 0;
}